

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O0

void __thiscall i2p_tests::unlimited_recv::test_method(unlimited_recv *this)

{
  long lVar1;
  bool bVar2;
  CService *message;
  long in_FS_OFFSET;
  bool proxy_error;
  Connection conn;
  DebugLogHelper debugloghelper20;
  DebugLogHelper debugloghelper19;
  Session session;
  Proxy sam_proxy;
  optional<CService> addr;
  CThreadInterrupt interrupt;
  CThreadInterrupt *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  Session *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  Connection *in_stack_fffffffffffffae8;
  size_t line_num;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffaf8;
  allocator<char> *__a;
  CThreadInterrupt *in_stack_fffffffffffffb00;
  char *__s;
  Proxy *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_stack_fffffffffffffb10;
  Session *this_01;
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [2];
  assertion_result local_488 [2];
  bool *in_stack_fffffffffffffbb0;
  Connection *in_stack_fffffffffffffbb8;
  CService *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f9;
  allocator<char> local_3d2 [34];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<std::unique_ptr<Sock,std::default_delete<Sock>>(int,int,int)>::operator=
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             in_stack_fffffffffffffac8,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
  CThreadInterrupt::CThreadInterrupt(in_stack_fffffffffffffab8);
  this_01 = (Session *)local_3d2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(in_stack_fffffffffffffad8,
             (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
  Lookup((string *)this_01,(uint16_t)((ulong)in_stack_fffffffffffffb10 >> 0x30),
         SUB81((ulong)in_stack_fffffffffffffb10 >> 0x28,0),(DNSLookupFn *)in_stack_fffffffffffffb08)
  ;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8);
  std::allocator<char>::~allocator(local_3d2);
  message = std::optional<CService>::value((optional<CService> *)in_stack_fffffffffffffac8);
  Proxy::Proxy((Proxy *)in_stack_fffffffffffffac8,
               (CService *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
  ArgsManager::GetDataDirNet
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
  fs::operator/((path *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                (char *)in_stack_fffffffffffffac8);
  i2p::sam::Session::Session
            (this_01,(path *)message,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  fs::path::~path((path *)in_stack_fffffffffffffab8);
  fs::path::~path((path *)in_stack_fffffffffffffab8);
  this_00 = &local_3f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  __s = &stack0xfffffffffffffbe0;
  std::function<bool(std::__cxx11::string_const*)>::
  function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)in_stack_fffffffffffffac8,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
  DebugLogHelper::DebugLogHelper((DebugLogHelper *)this_01,(string *)message,(MatchFn *)this_00);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
               *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  __a = (allocator<char> *)&stack0xfffffffffffffbde;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  file = (const_string *)&stack0xfffffffffffffbb8;
  std::function<bool(std::__cxx11::string_const*)>::
  function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)in_stack_fffffffffffffac8,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
  DebugLogHelper::DebugLogHelper((DebugLogHelper *)this_01,(string *)message,(MatchFn *)this_00);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
               *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbde);
  i2p::Connection::Connection(in_stack_fffffffffffffae8);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffac8,
               (pointer)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               (unsigned_long)in_stack_fffffffffffffab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffab8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,line_num,
               (const_string *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    CService::CService((CService *)in_stack_fffffffffffffab8);
    in_stack_fffffffffffffae7 =
         i2p::sam::Session::Connect
                   ((Session *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                    in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffac8,(bool)in_stack_fffffffffffffac7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffac8,
               (pointer)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               (unsigned_long)in_stack_fffffffffffffab8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffab8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffac8,
               (pointer)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
               (unsigned_long)in_stack_fffffffffffffab8);
    in_stack_fffffffffffffab8 = (CThreadInterrupt *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4a8,local_4c8,0x40,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffab8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffab8);
    CService::~CService((CService *)in_stack_fffffffffffffab8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  i2p::Connection::~Connection((Connection *)in_stack_fffffffffffffab8);
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffffab8);
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffffab8);
  i2p::sam::Session::~Session(in_stack_fffffffffffffac8);
  Proxy::~Proxy((Proxy *)in_stack_fffffffffffffab8);
  std::optional<CService>::~optional((optional<CService> *)in_stack_fffffffffffffab8);
  CThreadInterrupt::~CThreadInterrupt(in_stack_fffffffffffffab8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unlimited_recv)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>(std::string(i2p::sam::MAX_MSG_SIZE + 1, 'a'));
    };

    CThreadInterrupt interrupt;
    const std::optional<CService> addr{Lookup("127.0.0.1", 9000, false)};
    const Proxy sam_proxy(addr.value(), false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key", sam_proxy, &interrupt);

    {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("too many bytes without a terminator");

        i2p::Connection conn;
        bool proxy_error;
        BOOST_REQUIRE(!session.Connect(CService{}, conn, proxy_error));
    }
}